

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

void __thiscall
sisl::
array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::_alloc(array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         *this,uint n)

{
  Matrix<double,__1,_1,_0,__1,_1> *pMVar1;
  size_type j;
  Matrix<double,__1,_1,_0,__1,_1> local_30;
  ulong local_20;
  size_type i;
  array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *paStack_10;
  uint n_local;
  array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *this_local;
  
  if (n == 0) {
    this->_array = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  }
  else {
    i._4_4_ = n;
    paStack_10 = this;
    pMVar1 = __gnu_cxx::new_allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::allocate
                       ((new_allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,(ulong)n,
                        (void *)0x0);
    this->first = pMVar1;
    for (local_20 = 0; local_20 < i._4_4_; local_20 = local_20 + 1) {
      pMVar1 = this->first + local_20;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_30);
      __gnu_cxx::new_allocator<Eigen::Matrix<double,-1,1,0,-1,1>>::
      construct<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                ((new_allocator<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,pMVar1,&local_30);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_30);
    }
    this->last = this->first + local_20;
    this->_array = this->first;
  }
  return;
}

Assistant:

void _alloc(unsigned int n) {
            size_type i;
            if(n == 0) {
                this->_array = nullptr;
                return;
            }

            this->first = Allocator::allocate(n);
            try {
                for (i = 0; i < n; ++i) {
                    Allocator::construct(first + i, T());
                }
            }catch(...) {
                for(size_type j = 0; j < i; ++j) {
                     Allocator::destroy(first + j);
                }
                Allocator::deallocate(first, n);
                throw;
            }
            last = first + i;
            this->_array = static_cast<T *>(first);
        }